

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O3

void VRSHFT(int NN,int L3,double *ZR,double *ZI,int *CONV,double *SR,double *SI,double *PR,
           double *PI,double *QPR,double *QPI,double *PVR,double *PVI,double ARE,double MRE,
           double ETA,double INFIN,double *HR,double *HI,double *QHR,double *QHI,double *SHR,
           double *SHI,double *TR,double *TI)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined4 in_register_00000034;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_98;
  double local_88;
  uint local_34 [2];
  int BOOL;
  
  *(double *)CONV = *(double *)CONCAT44(in_register_00000034,L3);
  *SR = *ZR;
  *(undefined4 *)ZI = 0;
  iVar2 = 0;
  bVar1 = false;
  do {
    POLYEV(NN,(double *)CONV,SR,SI,PR,PI,QPR,QPI,PVR);
    dVar5 = ABS(*QPI);
    dVar6 = ABS(*PVR);
    if (dVar6 <= dVar5) {
      if (dVar5 <= dVar6) {
        dVar6 = dVar5 * 1.4142135623730951;
      }
      else {
        dVar6 = SQRT((dVar6 / dVar5) * (dVar6 / dVar5) + 1.0) * dVar5;
      }
    }
    else {
      dVar6 = SQRT((dVar5 / dVar6) * (dVar5 / dVar6) + 1.0) * dVar6;
    }
    dVar5 = *(double *)CONV;
    dVar7 = ABS(dVar5);
    dVar8 = ABS(*SR);
    if (dVar8 <= dVar7) {
      if (dVar7 <= dVar8) {
        dVar8 = dVar7 * 1.4142135623730951;
      }
      else {
        dVar8 = SQRT((dVar8 / dVar7) * (dVar8 / dVar7) + 1.0) * dVar7;
      }
    }
    else {
      dVar8 = SQRT((dVar7 / dVar8) * (dVar7 / dVar8) + 1.0) * dVar8;
    }
    dVar9 = ABS(*PI);
    dVar7 = ABS(*QPR);
    if (dVar7 <= dVar9) {
      if (dVar9 <= dVar7) {
        dVar7 = dVar9 * 1.4142135623730951;
      }
      else {
        dVar7 = SQRT((dVar7 / dVar9) * (dVar7 / dVar9) + 1.0) * dVar9;
      }
    }
    else {
      dVar7 = SQRT((dVar9 / dVar7) * (dVar9 / dVar7) + 1.0) * dVar7;
    }
    dVar7 = (dVar7 * MRE) / (ARE + MRE);
    if (0 < NN) {
      uVar3 = 0;
      do {
        dVar9 = ABS(PI[uVar3]);
        dVar10 = ABS(QPR[uVar3]);
        if (dVar10 <= dVar9) {
          if (dVar9 <= dVar10) {
            dVar10 = dVar9 * 1.4142135623730951;
          }
          else {
            dVar10 = SQRT((dVar10 / dVar9) * (dVar10 / dVar9) + 1.0) * dVar9;
          }
        }
        else {
          dVar10 = SQRT((dVar9 / dVar10) * (dVar9 / dVar10) + 1.0) * dVar10;
        }
        dVar7 = dVar7 * dVar8 + dVar10;
        uVar3 = uVar3 + 1;
      } while ((uint)NN != uVar3);
    }
    if (dVar6 <= (dVar7 * (ARE + MRE) - dVar6 * MRE) * 20.0) {
      *(undefined4 *)ZI = 1;
      *(double *)CONCAT44(in_register_00000034,L3) = dVar5;
      *ZR = *SR;
      return;
    }
    if (iVar2 != 0) {
      if (((bVar1) || (dVar6 < local_88)) || (0.05 <= local_98)) {
        if (local_88 < dVar6 * 0.1) {
          return;
        }
      }
      else {
        dVar6 = ETA;
        if (ETA <= local_98) {
          dVar6 = local_98;
        }
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        dVar5 = *(double *)CONV;
        dVar8 = *SR;
        *SR = dVar5 * dVar6 + (dVar6 + 1.0) * dVar8;
        *(double *)CONV = dVar5 * (dVar6 + 1.0) - dVar6 * dVar8;
        POLYEV(NN,(double *)CONV,SR,SI,PR,PI,QPR,QPI,PVR);
        iVar4 = 5;
        do {
          CALCT((int *)local_34,NN,(double *)CONV,SR,PVI,HR,HI,QHR,ARE,INFIN,QPI,PVR,QHI,SHR);
          NEXTH((int *)(ulong)local_34[0],NN,HI,QHR,PI,QPR,QHI,SHR,PVI,HR);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        bVar1 = true;
        dVar6 = INFIN;
      }
    }
    CALCT((int *)local_34,NN,(double *)CONV,SR,PVI,HR,HI,QHR,ARE,INFIN,QPI,PVR,QHI,SHR);
    NEXTH((int *)(ulong)local_34[0],NN,HI,QHR,PI,QPR,QHI,SHR,PVI,HR);
    CALCT((int *)local_34,NN,(double *)CONV,SR,PVI,HR,HI,QHR,ARE,INFIN,QPI,PVR,QHI,SHR);
    if (local_34[0] == 0) {
      dVar5 = ABS(*QHI);
      dVar8 = ABS(*SHR);
      if (dVar8 <= dVar5) {
        if (dVar5 <= dVar8) {
          dVar8 = dVar5 * 1.4142135623730951;
        }
        else {
          dVar8 = SQRT((dVar8 / dVar5) * (dVar8 / dVar5) + 1.0) * dVar5;
        }
      }
      else {
        dVar8 = SQRT((dVar5 / dVar8) * (dVar5 / dVar8) + 1.0) * dVar8;
      }
      dVar5 = ABS(*(double *)CONV);
      dVar7 = ABS(*SR);
      if (dVar7 <= dVar5) {
        if (dVar5 <= dVar7) {
          dVar7 = dVar5 * 1.4142135623730951;
        }
        else {
          dVar7 = SQRT((dVar7 / dVar5) * (dVar7 / dVar5) + 1.0) * dVar5;
        }
      }
      else {
        dVar7 = SQRT((dVar5 / dVar7) * (dVar5 / dVar7) + 1.0) * dVar7;
      }
      local_98 = dVar8 / dVar7;
      *(double *)CONV = *QHI + *(double *)CONV;
      *SR = *SR + *SHR;
    }
    iVar2 = iVar2 + 1;
    local_88 = dVar6;
  } while (iVar2 != 10);
  return;
}

Assistant:

static void VRSHFT(int NN, int L3, double *ZR, double *ZI, int *CONV,double *SR, double *SI,double *PR, double *PI, double *QPR, double *QPI, double *PVR, double *PVI,
	double ARE, double MRE, double ETA, double INFIN, double *HR, double *HI, double *QHR, double *QHI, double *SHR, double *SHI, double *TR, double *TI) {
	/*
	C CARRIES OUT THE THIRD STAGE ITERATION.
	C L3 - LIMIT OF STEPS IN STAGE 3.
	C ZR,ZI   - ON ENTRY CONTAINS THE INITIAL ITERATE, IF THE
	C ITERATION CONVERGES IT CONTAINS THE FINAL ITERATE
	C ON EXIT.
	C CONV    -  .TRUE. IF ITERATION CONVERGES
	*/
	double MP, MS, OMP, RELSTP, R1, R2, TP;
	int B,BOOL,i,j;
	*SR = *ZR;
	*SI = *ZI;
	B = 0;
	*CONV = 0;


	for (i = 0; i < L3; ++i) {
		POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
		MP = CMOD(PVR,PVI);
		MS = CMOD(SR, SI);
		if (MP <= 20.0*ERREV(NN, QPR, QPI, MS, MP, ARE, MRE)) {
			*CONV = 1;
			*ZR = *SR;
			*ZI = *SI;
			break;
		}
		else {//10
			if (i == 0) {
				OMP = MP;
			}
			else {
				if (!(B == 1 || MP < OMP || RELSTP >= .05)) {
					TP = RELSTP;
					B = 1;
					if (RELSTP < ETA) {
						TP = ETA;
					}
					R1 = sqrt(TP);
					R2 = *SR * (1.0 + R1) - *SI*R1;
					*SI = *SR*R1 + *SI*(1.0 + R1);
					*SR = R2;
					POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
					for (j = 0; j < 5;++j) {
						CALCT(&BOOL,NN,SR,SI,HR,HI,QHR, QHI,ARE,INFIN,PVR, PVI,TR,TI);
						NEXTH(&BOOL,NN,QHR,QHI,QPR,QPI,TR, TI, HR,HI);
					}
					OMP = INFIN;
				}
				else {
					if (MP*0.1 > OMP) {
						break;
					}
					OMP = MP;
				}

			}

			CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);
			NEXTH(&BOOL, NN, QHR, QHI, QPR, QPI, TR, TI, HR, HI);
			CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);

			if (BOOL == 0) {
				RELSTP = CMOD(TR, TI) / CMOD(SR, SI);
				*SR = *SR + *TR;
				*SI = *SI + *TI;
			}

		}
	}//60
}